

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::csharp::GetFullExtensionName_abi_cxx11_
                   (FieldDescriptor *descriptor)

{
  Descriptor *pDVar1;
  FieldDescriptor *in_RSI;
  string *in_RDI;
  char *in_stack_ffffffffffffff00;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  string local_c0 [24];
  FieldDescriptor *in_stack_ffffffffffffff58;
  string local_a0 [32];
  string local_80 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [32];
  FieldDescriptor *local_10;
  
  local_10 = in_RSI;
  pDVar1 = FieldDescriptor::extension_scope(in_RSI);
  if (pDVar1 == (Descriptor *)0x0) {
    FieldDescriptor::file(local_10);
    __rhs = local_c0;
    GetExtensionClassUnqualifiedName_abi_cxx11_((FileDescriptor *)in_stack_ffffffffffffff38);
    std::operator+(in_stack_ffffffffffffff08,(char *)__rhs);
    GetPropertyName_abi_cxx11_(in_stack_ffffffffffffff58);
    std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_c0);
  }
  else {
    FieldDescriptor::extension_scope(local_10);
    __lhs = &local_50;
    GetClassName_abi_cxx11_((Descriptor *)__lhs);
    std::operator+(__lhs,in_stack_ffffffffffffff00);
    GetPropertyName_abi_cxx11_(in_stack_ffffffffffffff58);
    std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return in_RDI;
}

Assistant:

std::string GetFullExtensionName(const FieldDescriptor* descriptor) {
  if (descriptor->extension_scope()) {
    return GetClassName(descriptor->extension_scope()) + ".Extensions." + GetPropertyName(descriptor);
  }
  else {
    return GetExtensionClassUnqualifiedName(descriptor->file())  + "." + GetPropertyName(descriptor);
  }
}